

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckEqualFailureIncludesCheckExpectedAndActual::RunImpl
          (TestCheckEqualFailureIncludesCheckExpectedAndActual *this)

{
  TestResults *pTVar1;
  char *pcVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  int local_880;
  int something;
  TestDetails local_878;
  TestResults results;
  RecordingReporter reporter;
  
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&results,&reporter.super_TestReporter);
  something = 2;
  local_880 = 1;
  UnitTest::TestDetails::TestDetails(&local_878,"","","",0);
  UnitTest::CheckEqual<int,int>(&results,&local_880,&something,&local_878);
  pcVar2 = strstr(reporter.lastFailedMessage,"xpected 1");
  if (pcVar2 == (char *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar4,0x51);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,"strstr(reporter.lastFailedMessage, \"xpected 1\")");
  }
  pcVar2 = strstr(reporter.lastFailedMessage,"was 2");
  if (pcVar2 == (char *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar4,0x52);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,"strstr(reporter.lastFailedMessage, \"was 2\")");
  }
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}